

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_Texture::IsTiled(ON_Texture *this,int dir,double *count,double *offset)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ulong uVar5;
  bool bVar6;
  
  if (count != (double *)0x0) {
    *count = 1.0;
  }
  if (offset != (double *)0x0) {
    *offset = 0.0;
  }
  if ((uint)dir < 4) {
    uVar2 = 0xffffffff;
    lVar3 = 0;
    pOVar4 = &this->m_uvw;
    do {
      uVar5 = 0;
      do {
        if (((uint)dir != uVar5) &&
           ((dVar1 = pOVar4->m_xform[0][uVar5], dVar1 != 0.0 || (NAN(dVar1))))) goto LAB_004d8632;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 3);
      bVar6 = uVar2 != 0xffffffff;
      uVar2 = (uint)lVar3;
      if (bVar6) {
        return false;
      }
LAB_004d8632:
      lVar3 = lVar3 + 1;
      pOVar4 = (ON_Xform *)(pOVar4->m_xform + 1);
    } while (lVar3 != 3);
    if (-1 < (int)uVar2) {
      if (count != (double *)0x0) {
        *count = (this->m_uvw).m_xform[uVar2][(uint)dir];
      }
      if (offset != (double *)0x0) {
        *offset = (this->m_uvw).m_xform[uVar2][3];
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Texture::IsTiled( int dir, double* count, double* offset ) const
{
  if ( count )
    *count = 1.0;
  if ( offset )
    *offset = 0.0;

  if ( 0 <= dir && dir <= 3 )
  {
    int row0=-1, row, col;
    for ( row = 0; row < 3; row++ )
    {
      for ( col = 0; col < 3; col++ )
      {
        if ( col != dir && 0.0 != m_uvw.m_xform[row][col] )
          break;
      }
      if ( 3 == col )
      {
        if ( -1 == row0 )
        {
          row0 = row;
        }
        else
          return false;
      }
    }
    if ( row0 >= 0 )
    {
      if (count)
        *count = m_uvw.m_xform[row0][dir];
      if ( offset )
        *offset = m_uvw.m_xform[row0][3];
      return true;
    }
  }

  return false;
}